

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lupica.c
# Opt level: O1

void stage_decode(Emulator *e)

{
  State *pSVar1;
  State *pSVar2;
  _Bool _Var3;
  undefined3 uVar4;
  Instr instr;
  
  if ((e->state).pipeline.id.s.active == true) {
    pSVar1 = &e->state;
    instr = decode((e->state).pc - 2,(u16)(e->state).pipeline.id.code);
    _Var3 = (pSVar1->pipeline).id.s.active;
    uVar4 = *(undefined3 *)&(pSVar1->pipeline).id.s.field_0x5;
    pSVar2 = &e->state;
    (pSVar2->pipeline).ex.s.iaddr = (pSVar1->pipeline).id.s.iaddr;
    (pSVar2->pipeline).ex.s.active = _Var3;
    *(undefined3 *)&(pSVar2->pipeline).ex.s.field_0x5 = uVar4;
    (e->state).pipeline.ex.s.step = (e->state).pipeline.id.s.step;
    (e->state).pipeline.ex.instr = instr;
    (e->state).pipeline.id.s.active = false;
    if (1 < e->verbosity) {
      printf("\x1b[36m%9s\x1b[37m[%08x]: ","decode",(ulong)(e->state).pipeline.id.s.iaddr);
      printf("      0x%04x => ",(ulong)(e->state).pipeline.id.code);
      print_instr(e,instr,false);
      putchar(10);
      return;
    }
  }
  return;
}

Assistant:

void stage_decode(Emulator* e) {
  StageID* id = &e->state.pipeline.id;
  StageEX* ex = &e->state.pipeline.ex;

  if (!id->s.active) {
    return;
  }

  Instr instr = decode(e->state.pc - 2, id->code);
  *ex = (StageEX){.s = id->s, .instr = instr};

  id->s.active = false;

  if (e->verbosity > 1) {
    print_stage(id->s, "decode");
    printf("      0x%04x => ", id->code);
    print_instr(e, instr, false);
    printf("\n");
  }
}